

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebug::putInt128(QDebug *this,void *p)

{
  long lVar1;
  long lVar2;
  undefined1 n [16];
  char *string;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  Int128Buffer buffer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar4[0] = -(*p == '\0');
  auVar4[1] = -(*(char *)((long)p + 1) == '\0');
  auVar4[2] = -(*(char *)((long)p + 2) == '\0');
  auVar4[3] = -(*(char *)((long)p + 3) == '\0');
  auVar4[4] = -(*(char *)((long)p + 4) == '\0');
  auVar4[5] = -(*(char *)((long)p + 5) == '\0');
  auVar4[6] = -(*(char *)((long)p + 6) == '\0');
  auVar4[7] = -(*(char *)((long)p + 7) == '\0');
  auVar4[8] = -(*(char *)((long)p + 8) == '\0');
  auVar4[9] = -(*(char *)((long)p + 9) == '\0');
  auVar4[10] = -(*(char *)((long)p + 10) == '\0');
  auVar4[0xb] = -(*(char *)((long)p + 0xb) == '\0');
  auVar4[0xc] = -(*(char *)((long)p + 0xc) == '\0');
  auVar4[0xd] = -(*(char *)((long)p + 0xd) == '\0');
  auVar4[0xe] = -(*(char *)((long)p + 0xe) == '\0');
  auVar4[0xf] = -(*(char *)((long)p + 0xf) == -0x80);
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf) ==
      0xffff) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QTextStream::operator<<(&this->stream->ts,(anonymous_namespace)::Q_INT128_MIN_STR);
      return;
    }
  }
  else {
    lVar2 = *(long *)((long)p + 8);
    uVar3 = lVar2 >> 0x3f;
    n._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    n._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    string = anon_unknown.dwarf_1f04a6::i128ToStringHelper
                       ((anon_unknown_dwarf_1f04a6 *)&stack0xffffffffffffffb8,
                        (Int128Buffer *)((*p ^ uVar3) - uVar3),(quint128)n);
    if (lVar2 < 0) {
      string[-1] = '-';
      string = string + -1;
    }
    QTextStream::operator<<(&this->stream->ts,string);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    qint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    if (i == Q_INT128_MIN) {
        // -i is not representable, hardcode the result:
        stream->ts << Q_INT128_MIN_STR;
    } else {
        Int128Buffer buffer;
        auto dst = i128ToStringHelper(buffer, i < 0 ? -i : i);
        if (i < 0)
            *--dst = '-';
        stream->ts << dst;
    }
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}